

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::BaseAssembler::embed(BaseAssembler *this,void *data,size_t dataSize)

{
  Logger *this_00;
  Error EVar1;
  CodeWriter writer;
  
  if ((this->super_BaseEmitter)._code != (CodeHolder *)0x0) {
    if (dataSize == 0) {
      EVar1 = 0;
    }
    else {
      writer._cursor = this->_bufferPtr;
      EVar1 = CodeWriter::ensureSpace(&writer,this,dataSize);
      if (EVar1 == 0) {
        CodeWriter::emitData(&writer,data,dataSize);
        this_00 = (this->super_BaseEmitter)._logger;
        if (this_00 != (Logger *)0x0) {
          Logger::logBinary(this_00,data,dataSize);
        }
        CodeWriter::done(&writer,this);
      }
    }
    return EVar1;
  }
  EVar1 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
  return EVar1;
}

Assistant:

Error BaseAssembler::embed(const void* data, size_t dataSize) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  if (dataSize == 0)
    return kErrorOk;

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, dataSize));

  writer.emitData(data, dataSize);

#ifndef ASMJIT_NO_LOGGING
  if (_logger)
    _logger->logBinary(data, dataSize);
#endif

  writer.done(this);
  return kErrorOk;
}